

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osrestad.c
# Opt level: O0

int os_get_str_rsc(int id,char *buf,size_t buflen)

{
  size_t sVar1;
  ulong in_RDX;
  char *in_RSI;
  uint in_EDI;
  int local_4;
  
  if (((int)in_EDI < 0) || (5 < in_EDI)) {
    local_4 = 1;
  }
  else {
    sVar1 = strlen(S_res_strings[(int)(in_EDI - 1)]);
    if (in_RDX < sVar1 + 1) {
      local_4 = 2;
    }
    else {
      strcpy(in_RSI,S_res_strings[(int)(in_EDI - 1)]);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int os_get_str_rsc(int id, char *buf, size_t buflen)
{
    /* 
     *   make sure the index is in range of our array - note that the
     *   index values start at 1, but our array starts at 0, so adjust
     *   accordingly 
     */
	if (id < 0 || (size_t)id >= sizeof(S_res_strings)/sizeof(S_res_strings[0]))
        return 1;

    /* make sure the buffer is large enough */
    if (buflen < strlen(S_res_strings[id-1]) + 1)
        return 2;

    /* copy the string */
    strcpy(buf, S_res_strings[id-1]);

    /* return success */
    return 0;
}